

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicInputBase::Run(BasicInputBase *this)

{
  CallLogWrapper *this_00;
  float fVar1;
  bool bVar2;
  GLuint GVar3;
  void *__s;
  long lVar4;
  long lVar5;
  undefined **ppuVar6;
  long lVar7;
  GLchar **ppGVar8;
  value_type_conflict5 *__val;
  byte bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  char *glsl_vs;
  Vec4 data [64];
  char *local_430;
  undefined8 local_428;
  float afStack_420 [254];
  
  bVar9 = 0;
  local_430 = 
  "#version 430 core\nlayout(location = 0) in vec4 vs_in_attrib[16];\nout StageData {\n  vec4 attrib[16];\n} vs_out;\nvoid main() {\n  for (int i = 0; i < vs_in_attrib.length(); ++i) {\n    vs_out.attrib[i] = vs_in_attrib[i];\n  }\n}"
  ;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glCreateProgram(this_00);
  this->m_po = GVar3;
  GVar3 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  glu::CallLogWrapper::glShaderSource(this_00,GVar3,1,&local_430,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar3);
  glu::CallLogWrapper::glAttachShader(this_00,this->m_po,GVar3);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar3);
  ppuVar6 = &PTR_anon_var_dwarf_64f5f7_020e8550;
  ppGVar8 = (GLchar **)&local_428;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *ppGVar8 = *ppuVar6;
    ppuVar6 = ppuVar6 + (ulong)bVar9 * -2 + 1;
    ppGVar8 = ppGVar8 + (ulong)bVar9 * -2 + 1;
  }
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (this_00,this->m_po,0x10,(GLchar **)&local_428,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_po);
  bVar2 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_po);
  lVar5 = -1;
  if (bVar2) {
    __s = operator_new(0x400);
    memset(__s,0,0x400);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_xfbo);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x400,__s,0x88e8);
    operator_delete(__s,0x400);
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_po);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    if (this->base_instance == 0xffffffff) {
      glu::CallLogWrapper::glDrawArraysInstanced(this_00,0,0,2,this->instance_count);
    }
    else {
      glu::CallLogWrapper::glDrawArraysInstancedBaseInstance
                (this_00,0,0,2,this->instance_count,this->base_instance);
    }
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    lVar5 = 0;
    memset(&local_428,0,0x400);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0x400,&local_428);
    lVar4 = 0;
    lVar7 = 0;
    do {
      fVar1 = *(float *)((long)this->expected_data[0].m_data + lVar4);
      if (0.01 < ABS(fVar1 - *(float *)((long)&local_428 + lVar4))) {
        fVar10 = *(float *)((long)afStack_420 + lVar4 + -4);
        fVar11 = *(float *)((long)this->expected_data[0].m_data + lVar4 + 4);
LAB_009feca0:
        fVar13 = *(float *)((long)afStack_420 + lVar4);
        fVar15 = *(float *)((long)afStack_420 + lVar4 + 4);
        fVar12 = *(float *)((long)this->expected_data[0].m_data + lVar4 + 8);
        fVar14 = *(float *)((long)this->expected_data[0].m_data + lVar4 + 0xc);
LAB_009fecba:
        anon_unknown_0::Output
                  ("Data is: %f %f %f %f, data should be: %f %f %f %f, index is: %d.\n",
                   (double)*(float *)((long)&local_428 + lVar4),(double)fVar10,(double)fVar13,
                   (double)fVar15,(double)fVar1,(double)fVar11,(double)fVar12,(double)fVar14);
        return -1;
      }
      fVar11 = *(float *)((long)this->expected_data[0].m_data + lVar4 + 4);
      fVar10 = *(float *)((long)afStack_420 + lVar4 + -4);
      if (0.01 < ABS(fVar11 - fVar10)) goto LAB_009feca0;
      fVar12 = *(float *)((long)this->expected_data[0].m_data + lVar4 + 8);
      fVar13 = *(float *)((long)afStack_420 + lVar4);
      if (0.01 < ABS(fVar12 - fVar13)) goto LAB_009feca0;
      fVar14 = *(float *)((long)this->expected_data[0].m_data + lVar4 + 0xc);
      fVar15 = *(float *)((long)afStack_420 + lVar4 + 4);
      if (0.01 < ABS(fVar14 - fVar15)) goto LAB_009fecba;
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar7 != 0x40);
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = "#version 430 core" NL "layout(location = 0) in vec4 vs_in_attrib[16];" NL
									"out StageData {" NL "  vec4 attrib[16];" NL "} vs_out;" NL "void main() {" NL
									"  for (int i = 0; i < vs_in_attrib.length(); ++i) {" NL
									"    vs_out.attrib[i] = vs_in_attrib[i];" NL "  }" NL "}";
		m_po = glCreateProgram();
		{
			const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glCompileShader(sh);
			glAttachShader(m_po, sh);
			glDeleteShader(sh);
		}
		{
			const GLchar* const v[16] = { "StageData.attrib[0]",  "StageData.attrib[1]",  "StageData.attrib[2]",
										  "StageData.attrib[3]",  "StageData.attrib[4]",  "StageData.attrib[5]",
										  "StageData.attrib[6]",  "StageData.attrib[7]",  "StageData.attrib[8]",
										  "StageData.attrib[9]",  "StageData.attrib[10]", "StageData.attrib[11]",
										  "StageData.attrib[12]", "StageData.attrib[13]", "StageData.attrib[14]",
										  "StageData.attrib[15]" };
			glTransformFeedbackVaryings(m_po, 16, v, GL_INTERLEAVED_ATTRIBS);
		}
		glLinkProgram(m_po);
		if (!CheckProgram(m_po))
			return ERROR;

		{
			std::vector<GLubyte> zero(sizeof(expected_data));
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfbo);
			glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(expected_data), &zero[0], GL_DYNAMIC_DRAW);
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_po);
		glBeginTransformFeedback(GL_POINTS);
		if (base_instance != -1)
		{
			glDrawArraysInstancedBaseInstance(GL_POINTS, 0, 2, instance_count, static_cast<GLuint>(base_instance));
		}
		else
		{
			glDrawArraysInstanced(GL_POINTS, 0, 2, instance_count);
		}
		glEndTransformFeedback();

		Vec4 data[64];
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(Vec4) * 64, &data[0]);

		long status = NO_ERROR;
		for (int i = 0; i < 64; ++i)
		{
			if (!ColorEqual(expected_data[i], data[i], Vec4(0.01f)))
			{
				Output("Data is: %f %f %f %f, data should be: %f %f %f %f, index is: %d.\n", data[i][0], data[i][1],
					   data[i][2], data[i][3], expected_data[i][0], expected_data[i][1], expected_data[i][2],
					   expected_data[i][3], i);
				status = ERROR;
				break;
			}
		}
		return status;
	}